

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O1

int h262_coded_block_pattern(bitstream *str,int chroma_format,uint32_t *cbp)

{
  bool bVar1;
  undefined4 in_EAX;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t tmp;
  uint32_t cbplo;
  undefined8 local_38;
  
  local_38 = CONCAT44(*cbp,in_EAX) & 0x3fffffffff;
  if (chroma_format == 1) {
    bVar1 = false;
    iVar5 = 0;
  }
  else {
    if (chroma_format == 3) {
      iVar5 = 6;
    }
    else {
      if (chroma_format != 2) {
        h262_coded_block_pattern_cold_1();
        return 1;
      }
      iVar5 = 2;
    }
    bVar1 = true;
  }
  iVar2 = vs_vlc(str,(uint32_t *)((long)&local_38 + 4),cbp_vlc);
  iVar4 = 1;
  if (iVar2 == 0) {
    uVar6 = local_38._4_4_;
    if (bVar1) {
      uVar3 = 0;
      do {
        local_38 = CONCAT44(local_38._4_4_,(uint)((*cbp >> (uVar3 & 0x1f) & 1) != 0));
        iVar2 = vs_u(str,(uint32_t *)&local_38,1);
        if (iVar2 != 0) {
          return 1;
        }
        uVar6 = uVar6 | (uint32_t)local_38 << ((byte)uVar3 & 0x1f);
        uVar3 = uVar3 + 1;
      } while (iVar5 + (uint)(iVar5 == 0) != uVar3);
    }
    iVar4 = 0;
    if (str->dir == VS_DECODE) {
      *cbp = uVar6;
    }
  }
  return iVar4;
}

Assistant:

int h262_coded_block_pattern(struct bitstream *str, int chroma_format, uint32_t *cbp) {
	uint32_t cbplo = *cbp & 0x3f;
	int cbphs;
	int i;
	uint32_t val;
	switch (chroma_format) {
		case 1:
			cbphs = 0;
			break;
		case 2:
			cbphs = 2;
			break;
		case 3:
			cbphs = 6;
			break;
		default:
			fprintf(stderr, "Invalid chroma format\n");
			return 1;
	}
	if (vs_vlc(str, &cbplo, cbp_vlc)) return 1;
	val = cbplo;
	for (i = 0; i < cbphs; i++) {
		uint32_t tmp = *cbp >> i & 1;
		if (vs_u(str, &tmp, 1)) return 1;
		val |= tmp << i;
	}	
	if (str->dir == VS_DECODE)
		*cbp = val;
	return 0;
}